

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<false>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  PathTypeHandlerBase *this_00;
  DynamicTypeHandler *pDVar9;
  undefined7 in_register_00000089;
  uint32 local_58;
  undefined4 local_54;
  uint32 indexVal;
  PropertyValueInfo *local_48;
  Var local_40;
  char local_32;
  SideEffects local_31;
  ObjectSlotAttributes *instanceAttributes;
  
  local_54 = (undefined4)CONCAT71(in_register_00000089,attr);
  local_32 = isInit;
  local_31 = possibleSideEffects;
  _indexVal = (ulong)flags;
  local_48 = info;
  local_40 = value;
  if (0xf < (uint)propertyId && value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar5) goto LAB_00dc6514;
    *puVar8 = 0;
  }
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar5)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = pSVar1->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  pTVar3 = (instance->super_RecyclableObject).type.ptr;
  if (index == 0xffff) {
    BVar7 = ScriptContext::IsNumericPropertyId
                      ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyId,&local_58);
    if (BVar7 == 0) {
      BVar7 = AddPropertyInternal(this,instance,propertyId,local_40,(ObjectSlotAttributes)local_54,
                                  local_48,(PropertyOperationFlags)_indexVal,local_31);
      return BVar7;
    }
    BVar7 = DynamicTypeHandler::SetItem
                      (&this->super_DynamicTypeHandler,instance,local_58,local_40,
                       PropertyOperation_None);
    return BVar7;
  }
  if ((*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01') &&
     (((this->super_DynamicTypeHandler).flags & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x327,
                                "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
    if (!bVar5) {
LAB_00dc6514:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (local_32 != '\0') {
    iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    instanceAttributes = (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar6);
    if ((instanceAttributes != (ObjectSlotAttributes *)0x0) &&
       ((instanceAttributes[index] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None)) {
      BVar7 = SetAttributesHelper(this,instance,propertyId,index,instanceAttributes,
                                  instanceAttributes[index] & ~ObjectSlotAttr_Accessor,true);
      if (BVar7 != 0) {
        if (local_48 != (PropertyValueInfo *)0x0) {
          local_48->m_instance = &instance->super_RecyclableObject;
          local_48->m_propertyIndex = 0xffff;
          local_48->m_attributes = '\0';
          local_48->flags = InlineCacheNoFlags;
        }
        FromTypeHandler(*(DynamicTypeHandler **)((instance->super_RecyclableObject).type.ptr + 1));
        DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,local_40);
        return 1;
      }
      pDVar9 = DynamicObject::GetTypeHandler(instance);
      iVar6 = (*pDVar9->_vptr_DynamicTypeHandler[0x16])
                        (pDVar9,instance,(ulong)(uint)propertyId,local_40,_indexVal,local_48);
      return iVar6;
    }
  }
  this_00 = FromTypeHandler(*(DynamicTypeHandler **)
                             ((instance->super_RecyclableObject).type.ptr + 1));
  SetSlotAndCache(this_00,instance,propertyId,(PropertyRecord *)0x0,index,local_40,local_48,
                  (PropertyOperationFlags)_indexVal,local_31);
  return 1;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }